

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::draw(XFormWidget *this)

{
  allocator<unsigned_char> *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  reference pvVar2;
  reference pvVar3;
  allocator<unsigned_char> local_dd;
  uchar local_dc [4];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> white;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> blue;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> green;
  allocator<unsigned_char> local_3d;
  uchar local_3c [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> red;
  XFormWidget *this_local;
  
  if ((this->target).object != (SceneObject *)0x0) {
    local_3c[0] = 0xff;
    local_3c[1] = 0;
    local_3c[2] = 0;
    local_3c[3] = 0x40;
    local_38 = local_3c;
    local_30 = 4;
    red.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    std::allocator<unsigned_char>::allocator(&local_3d);
    __l_02._M_len = local_30;
    __l_02._M_array = local_38;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l_02,&local_3d);
    std::allocator<unsigned_char>::~allocator(&local_3d);
    blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0xff;
    blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0x40;
    paVar1 = (allocator<unsigned_char> *)
             ((long)&blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<unsigned_char>::allocator(paVar1);
    __l_01._M_len = 4;
    __l_01._M_array =
         (iterator)
         ((long)&blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__l_01,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&blue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0xff;
    white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0x40;
    paVar1 = (allocator<unsigned_char> *)
             ((long)&white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<unsigned_char>::allocator(paVar1);
    __l_00._M_len = 4;
    __l_00._M_array =
         (iterator)
         ((long)&white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,__l_00,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&white.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    local_dc[0] = 0xff;
    local_dc[1] = 0xff;
    local_dc[2] = 0xff;
    local_dc[3] = 0x40;
    local_d8 = local_dc;
    local_d0 = 4;
    std::allocator<unsigned_char>::allocator(&local_dd);
    __l._M_len = local_d0;
    __l._M_array = local_d8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,__l,&local_dd);
    std::allocator<unsigned_char>::~allocator(&local_dd);
    if ((this->target).axis == X) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,2);
      *pvVar2 = 0x80;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,1);
      *pvVar2 = 0x80;
    }
    if ((this->target).axis == Y) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,2);
      *pvVar2 = '@';
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      *pvVar2 = '@';
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,1);
      *pvVar2 = 0xc4;
    }
    if ((this->target).axis == Z) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,1);
      *pvVar2 = 0x80;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,0);
      *pvVar2 = 0x80;
    }
    if ((this->target).axis == Center) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,2);
      *pvVar2 = 0xc0;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,1);
      *pvVar2 = 0xc0;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,0);
      *pvVar2 = 0xc0;
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(&this->axisColors,4);
    pvVar3 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&this->axisColors,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (pvVar3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    pvVar3 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&this->axisColors,1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (pvVar3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    pvVar3 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&this->axisColors,2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (pvVar3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    pvVar3 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&this->axisColors,3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (pvVar3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    glPushMatrix();
    glDisable(0xb50);
    glDisable(0xb71);
    glEnable(0xbe2);
    glBlendFunc(0x302,0x303);
    drawHandles(this);
    glDisable(0xbe2);
    glEnable(0xb71);
    drawHandles(this);
    glEnable(0xb50);
    glPopMatrix();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  }
  return;
}

Assistant:

void XFormWidget::draw()
{
   if( target.object == nullptr ) return;

   vector<GLubyte>   red = { 255, 0,   0,   64 };
   vector<GLubyte> green = { 0,   255, 0,   64 };
   vector<GLubyte>  blue = { 0,   0,   255, 64 };
   vector<GLubyte> white = { 255, 255, 255, 64 };

   if( target.axis == Selection::Axis::X )      { red[1] = red[2] = 128; }
   if( target.axis == Selection::Axis::Y )      { green[0] = green[2] = 64; green[1] = 196; }
   if( target.axis == Selection::Axis::Z )      { blue[0] = blue[1] = 128; }
   if( target.axis == Selection::Axis::Center ) { white[0] = white[1] = white[2] = 192; }

   axisColors.resize(4);
   axisColors[0] = red;
   axisColors[1] = green;
   axisColors[2] = blue;
   axisColors[3] = white;

   glPushMatrix();
   glDisable( GL_LIGHTING );

   glDisable( GL_DEPTH_TEST );
   glEnable( GL_BLEND );
   glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );
   drawHandles();

   glDisable( GL_BLEND );
   glEnable( GL_DEPTH_TEST );
   drawHandles();
   glEnable( GL_LIGHTING );
   glPopMatrix();
}